

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O0

bool __thiscall irr::scene::CB3DMeshFileLoader::readChunkTEXS(CB3DMeshFileLoader *this)

{
  pointer pSVar1;
  SB3dChunk *pSVar2;
  long lVar3;
  CB3DMeshFileLoader *this_00;
  array<irr::scene::SB3dChunk> *in_RDI;
  SB3dTexture *B3dTexture;
  SB3dTexture *in_stack_ffffffffffffff48;
  CB3DMeshFileLoader *in_stack_ffffffffffffff50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  string local_70 [32];
  SB3dTexture *local_50;
  undefined1 local_48 [72];
  
  while( true ) {
    pSVar2 = core::array<irr::scene::SB3dChunk>::getLast((array<irr::scene::SB3dChunk> *)0x2cd4da);
    __first._M_current = (char *)pSVar2->startposition;
    pSVar2 = core::array<irr::scene::SB3dChunk>::getLast((array<irr::scene::SB3dChunk> *)0x2cd4f1);
    this_00 = (CB3DMeshFileLoader *)(__first._M_current + pSVar2->length);
    lVar3 = (**(code **)(*(long *)in_RDI[6].m_data.
                                  super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x18))();
    if ((long)this_00 <= lVar3) break;
    __last._M_current =
         (char *)&in_RDI[2].m_data.
                  super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    memset(local_48,0,0x40);
    SB3dTexture::SB3dTexture((SB3dTexture *)0x2cd551);
    core::array<irr::scene::SB3dTexture>::push_back
              ((array<irr::scene::SB3dTexture> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48
              );
    SB3dTexture::~SB3dTexture((SB3dTexture *)0x2cd56a);
    local_50 = core::array<irr::scene::SB3dTexture>::getLast
                         ((array<irr::scene::SB3dTexture> *)0x2cd578);
    readString_abi_cxx11_(this_00);
    ::std::__cxx11::string::operator=((string *)local_50,local_70);
    ::std::__cxx11::string::~string(local_70);
    ::std::__cxx11::string::begin();
    ::std::__cxx11::string::end();
    ::std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,__last,(char *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    pSVar1 = in_RDI[6].m_data.
             super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (*(code *)**(undefined8 **)pSVar1)(pSVar1,&local_50->Flags,4);
    pSVar1 = in_RDI[6].m_data.
             super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (*(code *)**(undefined8 **)pSVar1)(pSVar1,&local_50->Blend,4);
    readFloats(in_stack_ffffffffffffff50,(f32 *)in_stack_ffffffffffffff48,0);
    readFloats(in_stack_ffffffffffffff50,(f32 *)in_stack_ffffffffffffff48,0);
    readFloats(in_stack_ffffffffffffff50,(f32 *)in_stack_ffffffffffffff48,0);
    readFloats(in_stack_ffffffffffffff50,(f32 *)in_stack_ffffffffffffff48,0);
    readFloats(in_stack_ffffffffffffff50,(f32 *)in_stack_ffffffffffffff48,0);
  }
  core::array<irr::scene::SB3dChunk>::size((array<irr::scene::SB3dChunk> *)0x2cd6bb);
  core::array<irr::scene::SB3dChunk>::erase(in_RDI,(u32)((ulong)this_00 >> 0x20));
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkTEXS()
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkTEXS";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
	{
		Textures.push_back(SB3dTexture());
		SB3dTexture &B3dTexture = Textures.getLast();

		B3dTexture.TextureName = readString();
		std::replace(B3dTexture.TextureName.begin(), B3dTexture.TextureName.end(), '\\', '/');
#ifdef _B3D_READER_DEBUG
		os::Printer::log("read Texture", B3dTexture.TextureName.c_str(), ELL_DEBUG);
#endif

		B3DFile->read(&B3dTexture.Flags, sizeof(s32));
		B3DFile->read(&B3dTexture.Blend, sizeof(s32));
#ifdef __BIG_ENDIAN__
		B3dTexture.Flags = os::Byteswap::byteswap(B3dTexture.Flags);
		B3dTexture.Blend = os::Byteswap::byteswap(B3dTexture.Blend);
#endif
#ifdef _B3D_READER_DEBUG
		os::Printer::log("Flags", core::stringc(B3dTexture.Flags).c_str(), ELL_DEBUG);
		os::Printer::log("Blend", core::stringc(B3dTexture.Blend).c_str(), ELL_DEBUG);
#endif
		readFloats(&B3dTexture.Xpos, 1);
		readFloats(&B3dTexture.Ypos, 1);
		readFloats(&B3dTexture.Xscale, 1);
		readFloats(&B3dTexture.Yscale, 1);
		readFloats(&B3dTexture.Angle, 1);
	}

	B3dStack.erase(B3dStack.size() - 1);

	return true;
}